

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithoutParameterSetOrNotFound_Test::testBody
          (TEST_MockExpectedCall_callWithoutParameterSetOrNotFound_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  int iVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  SimpleString local_b0;
  SimpleString local_a0;
  MockNamedValue local_90;
  SimpleString local_30;
  SimpleString local_20;
  TEST_MockExpectedCall_callWithoutParameterSetOrNotFound_Test *local_10;
  TEST_MockExpectedCall_callWithoutParameterSetOrNotFound_Test *this_local;
  
  local_10 = this;
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_30,"nonexisting");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x28])(&local_20,pMVar1,&local_30);
  pcVar4 = SimpleString::asCharString(&local_20);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,"",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xaf,pTVar5);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&local_30);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_a0,"nonexisting");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_90,pMVar1,&local_a0);
  iVar2 = MockNamedValue::getIntValue(&local_90);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0,(long)iVar2,
             "LONGS_EQUAL(0, call->getInputParameter(\"nonexisting\").getIntValue()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xb0,pTVar5);
  MockNamedValue::~MockNamedValue(&local_90);
  SimpleString::~SimpleString(&local_a0);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_b0,"nonexisting");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2a])(pMVar1,&local_b0);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)((byte)((byte)iVar2 ^ 1) & 1),"CHECK",
             "!call->hasInputParameterWithName(\"nonexisting\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xb1,pTVar5);
  SimpleString::~SimpleString(&local_b0);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithoutParameterSetOrNotFound)
{
    STRCMP_EQUAL("", call->getInputParameterType("nonexisting").asCharString());
    LONGS_EQUAL(0, call->getInputParameter("nonexisting").getIntValue());
    CHECK(!call->hasInputParameterWithName("nonexisting"));
}